

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
TransitionObservationIndependentMADPDiscrete::JointToIndividualStateIndices
          (TransitionObservationIndependentMADPDiscrete *this,Index jointSI)

{
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
  *this_00;
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr *pp_Var5;
  bool bVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ind_sI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_40;
  
  if (this->_m_jointIndicesCached == true) {
    pp_Var5 = (_Base_ptr *)
              ((this->_m_indivStateIndices).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + jointSI);
  }
  else {
    p_Var4 = &(this->_m_indivStateIndicesMap->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var1 = (this->_m_indivStateIndicesMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    p_Var2 = p_Var4;
    for (p_Var3 = p_Var1; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar6]) {
      bVar6 = p_Var3[1]._M_color < jointSI;
      if (!bVar6) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = p_Var4;
    if ((p_Var2 != p_Var4) && (p_Var3 = p_Var2, jointSI < p_Var2[1]._M_color)) {
      p_Var3 = p_Var4;
    }
    p_Var2 = p_Var4;
    if (p_Var3 == p_Var4) {
      IndexTools::JointToIndividualIndicesStepSize(&local_58,jointSI,&this->_m_stateStepSize);
      this_00 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                 *)this->_m_indivStateIndicesMap;
      local_40.first = jointSI;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_40.second,&local_58);
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::_Select1st<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
      ::
      _M_emplace_unique<std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (this_00,&local_40);
      if (local_40.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_40.second.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_40.second.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.second.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var4 = &(this->_m_indivStateIndicesMap->_M_t)._M_impl.super__Rb_tree_header._M_header;
      p_Var1 = p_Var4;
      for (p_Var3 = (this->_m_indivStateIndicesMap->_M_t)._M_impl.super__Rb_tree_header._M_header.
                    _M_parent; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar6]) {
        bVar6 = p_Var3[1]._M_color < jointSI;
        if (!bVar6) {
          p_Var1 = p_Var3;
        }
      }
      if ((p_Var1 != p_Var4) && (p_Var1[1]._M_color <= jointSI)) {
        p_Var4 = p_Var1;
      }
      if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      for (; p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[bVar6]) {
        bVar6 = p_Var1[1]._M_color < jointSI;
        if (!bVar6) {
          p_Var2 = p_Var1;
        }
      }
      if ((p_Var2 != p_Var4) && (p_Var2[1]._M_color <= jointSI)) {
        p_Var4 = p_Var2;
      }
    }
    pp_Var5 = &p_Var4[1]._M_parent;
  }
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pp_Var5;
}

Assistant:

const std::vector<Index>& JointToIndividualStateIndices(Index jointSI) const
        {
            if(_m_jointIndicesCached)
                return _m_indivStateIndices[jointSI];
            else if (_m_indivStateIndicesMap->find(jointSI)!=
                     _m_indivStateIndicesMap->end())
                return(_m_indivStateIndicesMap->find(jointSI)->second);
            else
            {
                std::vector<Index> ind_sI=
                    IndexTools::JointToIndividualIndicesStepSize(jointSI,_m_stateStepSize);
                _m_indivStateIndicesMap->insert(make_pair(jointSI,ind_sI));
                return(_m_indivStateIndicesMap->find(jointSI)->second);
            }
        }